

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDate __thiscall QDate::fromString(QDate *this,QStringView string,DateFormat format)

{
  int d;
  int m;
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  ParsedRfcDateTime PVar3;
  ParsedInt PVar4;
  ParsedInt PVar5;
  ParsedInt PVar6;
  QStringView s;
  QStringView text;
  QStringView text_00;
  QStringView text_01;
  bool ok;
  iterator it;
  QDate local_b8;
  QStringTokenizerBase<QStringView,_QChar> local_b0;
  undefined1 local_90 [24];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  s.m_data = (storage_type_conflict *)string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this != (QDate *)0x0) {
    if ((int)string.m_data != 1) {
      if ((int)string.m_data == 8) {
        s.m_size = (qsizetype)this;
        PVar3 = rfcDateImpl(s);
        local_b8 = PVar3.date.jd;
        goto LAB_0030c9f6;
      }
      local_90._16_8_ = &local_78;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_90._0_8_ = 4;
      local_90._8_8_ = 0;
      local_b0.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
      local_b0.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
      local_b0.m_needle.ucs = L' ';
      local_b0._26_6_ = 0xaaaaaaaaaaaa;
      it.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      it.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      it.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      it.current.value.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      it.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      it.tokenizer = (QStringTokenizerBase<QStringView,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
      it.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b0.m_haystack.m_size = (qsizetype)this;
      local_b0.m_haystack.m_data = s.m_data;
      QStringTokenizerBase<QStringView,_QChar>::iterator::iterator(&it,&local_b0);
      iVar1 = 4;
      while( true ) {
        bVar2 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if ((bVar2) || (it.current.ok == false)) break;
        QVarLengthArray<QStringView,4ll>::emplace_back<QStringView_const&>
                  ((QVarLengthArray<QStringView,4ll> *)local_90,&it.current.value);
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&it);
      }
      if ((local_90._8_8_ == 4) && (it.current.ok != true)) {
        ok = false;
        iVar1 = QStringView::toInt((QStringView *)(local_90._16_8_ + 0x30),&ok,10);
        if ((ok != true) ||
           (((d = QStringView::toInt((QStringView *)(local_90._16_8_ + 0x20),&ok,10), d == 0 ||
             (ok == false)) ||
            (m = fromShortMonthName(*(QStringView *)(local_90._16_8_ + 0x10)), m == -1))))
        goto LAB_0030c9dd;
        QDate(&local_b8,iVar1,m,d);
      }
      else {
LAB_0030c9dd:
        local_b8.jd = -0x8000000000000000;
      }
      QVarLengthArray<QStringView,_4LL>::~QVarLengthArray
                ((QVarLengthArray<QStringView,_4LL> *)local_90);
      goto LAB_0030c9f6;
    }
    if ((((9 < (long)this) && (bVar2 = QChar::isPunct((uint)(ushort)s.m_data[4]), bVar2)) &&
        (bVar2 = QChar::isPunct((uint)(ushort)s.m_data[7]), bVar2)) &&
       ((this == (QDate *)0xa || (bVar2 = QChar::isDigit((uint)(ushort)s.m_data[10]), !bVar2)))) {
      text.m_data = s.m_data;
      text.m_size = 4;
      PVar4 = anon_unknown.dwarf_cc2be5::readInt(text);
      text_00.m_data = s.m_data + 5;
      text_00.m_size = 2;
      PVar5 = anon_unknown.dwarf_cc2be5::readInt(text_00);
      text_01.m_data = s.m_data + 8;
      text_01.m_size = 2;
      PVar6 = anon_unknown.dwarf_cc2be5::readInt(text_01);
      if (0 < PVar6.used && ((0 < PVar5.used && 0 < PVar4.used) && PVar4.result - 1 < 9999)) {
        QDate(&local_b8,(int)PVar4.result,(int)PVar5.result,(int)PVar6.result);
        goto LAB_0030c9f6;
      }
    }
  }
  local_b8.jd = -0x8000000000000000;
LAB_0030c9f6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDate)local_b8.jd;
}

Assistant:

QDate QDate::fromString(QStringView string, Qt::DateFormat format)
{
    if (string.isEmpty())
        return QDate();

    switch (format) {
    case Qt::RFC2822Date:
        return rfcDateImpl(string).date;
    default:
    case Qt::TextDate: {
        // Documented as "ddd MMM d yyyy"
        QVarLengthArray<QStringView, 4> parts;
        auto tokens = string.tokenize(u' ', Qt::SkipEmptyParts);
        auto it = tokens.begin();
        for (int i = 0; i < 4 && it != tokens.end(); ++i, ++it)
            parts.emplace_back(*it);

        if (parts.size() != 4 || it != tokens.end())
            return QDate();

        bool ok = false;
        int year = parts.at(3).toInt(&ok);
        int day = ok ? parts.at(2).toInt(&ok) : 0;
        if (!ok || !day)
            return QDate();

        const int month = fromShortMonthName(parts.at(1));
        if (month == -1) // Month name matches no English or localised name.
            return QDate();

        return QDate(year, month, day);
        }
    case Qt::ISODate:
        // Semi-strict parsing, must be long enough and have punctuators as separators
        if (string.size() >= 10 && string[4].isPunct() && string[7].isPunct()
                && (string.size() == 10 || !string[10].isDigit())) {
            const ParsedInt year = readInt(string.first(4));
            const ParsedInt month = readInt(string.sliced(5, 2));
            const ParsedInt day = readInt(string.sliced(8, 2));
            if (year.ok() && year.result > 0 && year.result <= 9999 && month.ok() && day.ok())
                return QDate(year.result, month.result, day.result);
        }
        break;
    }
    return QDate();
}